

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# find_data.cpp
# Opt level: O0

void __thiscall libtorrent::dht::find_data::done(find_data *this)

{
  bool bVar1;
  byte bVar2;
  uint32_t uVar3;
  node *this_00;
  pointer ppVar4;
  element_type *peVar5;
  node_id *pnVar6;
  pointer ppVar7;
  endpoint *ep;
  endpoint *ep_00;
  endpoint *ep_01;
  endpoint local_194;
  string local_178;
  endpoint local_154;
  node_entry local_138;
  endpoint local_f4;
  string local_d8;
  _Self local_b8;
  _Self local_b0;
  iterator j;
  string local_88;
  undefined1 local_63;
  uchar local_62;
  bitfield_flag local_61;
  __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_60
  ;
  observer_ptr *o;
  iterator end;
  iterator i;
  int local_34;
  undefined1 local_30 [4];
  int num_results;
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  results;
  dht_observer *logger;
  find_data *this_local;
  
  this->m_done = true;
  this_00 = traversal_algorithm::get_node(&this->super_traversal_algorithm);
  ppVar4 = (pointer)dht::node::observer(this_00);
  results.
  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar4;
  if (ppVar4 != (pointer)0x0) {
    uVar3 = traversal_algorithm::id(&this->super_traversal_algorithm);
    (*(this->super_traversal_algorithm)._vptr_traversal_algorithm[2])();
    (*((_func_int **)(ppVar4->first).first_seen.__d.__r)[1])(ppVar4,4,"[%u] %s DONE",(ulong)uVar3);
  }
  ::std::
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_30);
  local_34 = routing_table::bucket_size(&((this->super_traversal_algorithm).m_node)->m_table);
  end = ::std::
        vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
        ::begin(&(this->super_traversal_algorithm).m_results);
  o = (observer_ptr *)
      ::std::
      vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>
      ::end(&(this->super_traversal_algorithm).m_results);
  while (bVar1 = __gnu_cxx::operator!=
                           (&end,(__normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                                  *)&o), bVar1 && 0 < local_34) {
    local_60 = (__shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)__gnu_cxx::
                  __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
                  ::operator*(&end);
    peVar5 = ::std::
             __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->(local_60);
    local_62 = (peVar5->flags).m_val;
    local_63 = 0x40;
    local_61 = (bitfield_flag)
               libtorrent::flags::operator&
                         ((bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>)
                          local_62,(bitfield_flag<unsigned_char,_libtorrent::dht::observer_flags_tag,_void>
                                    )0x40);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_61);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_60);
      pnVar6 = observer::id(peVar5);
      local_b0._M_node =
           (_Base_ptr)
           ::std::
           map<libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find(&this->m_write_tokens,pnVar6);
      local_b8._M_node =
           (_Base_ptr)
           ::std::
           map<libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<libtorrent::digest32<160L>_>,_std::allocator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end(&this->m_write_tokens);
      bVar1 = ::std::operator==(&local_b0,&local_b8);
      if (bVar1) {
        if ((results.
             super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
           (bVar2 = (**(code **)((results.
                                  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                first_seen.__d.__r)
                              (results.
                               super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,4),
           ppVar4 = results.
                    super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, (bVar2 & 1) != 0)) {
          uVar3 = traversal_algorithm::id(&this->super_traversal_algorithm);
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_60);
          observer::target_ep(&local_f4,peVar5);
          libtorrent::aux::print_endpoint_abi_cxx11_(&local_d8,(aux *)&local_f4,ep_00);
          ::std::__cxx11::string::c_str();
          (**(code **)((ppVar4->first).first_seen.__d.__r + 8))
                    (ppVar4,4,"[%u] no write token: %s",uVar3);
          ::std::__cxx11::string::~string((string *)&local_d8);
        }
      }
      else {
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_60);
        pnVar6 = observer::id(peVar5);
        peVar5 = ::std::
                 __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->(local_60);
        observer::target_ep(&local_154,peVar5);
        node_entry::node_entry(&local_138,pnVar6,&local_154,0xffff,false);
        ppVar7 = ::std::
                 _Rb_tree_iterator<std::pair<const_libtorrent::digest32<160L>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator->(&local_b0);
        ::std::
        vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>
        ::emplace_back<libtorrent::dht::node_entry,std::__cxx11::string&>
                  ((vector<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>,std::allocator<std::pair<libtorrent::dht::node_entry,std::__cxx11::string>>>
                    *)local_30,&local_138,&ppVar7->second);
        if ((results.
             super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
           (bVar2 = (**(code **)((results.
                                  super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                first_seen.__d.__r)
                              (results.
                               super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,4),
           ppVar4 = results.
                    super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage, (bVar2 & 1) != 0)) {
          uVar3 = traversal_algorithm::id(&this->super_traversal_algorithm);
          peVar5 = ::std::
                   __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->(local_60);
          observer::target_ep(&local_194,peVar5);
          libtorrent::aux::print_endpoint_abi_cxx11_(&local_178,(aux *)&local_194,ep_01);
          ::std::__cxx11::string::c_str();
          (**(code **)((ppVar4->first).first_seen.__d.__r + 8))(ppVar4,4,"[%u] %s",uVar3);
          ::std::__cxx11::string::~string((string *)&local_178);
        }
        local_34 = local_34 + -1;
      }
    }
    else if ((results.
              super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage != (pointer)0x0) &&
            (bVar2 = (**(code **)((results.
                                   super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage)->first).
                                 first_seen.__d.__r)
                               (results.
                                super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,4),
            ppVar4 = results.
                     super__Vector_base<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage, (bVar2 & 1) != 0)) {
      uVar3 = traversal_algorithm::id(&this->super_traversal_algorithm);
      peVar5 = ::std::
               __shared_ptr_access<libtorrent::dht::observer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(local_60);
      observer::target_ep((endpoint *)((long)&j._M_node + 4),peVar5);
      libtorrent::aux::print_endpoint_abi_cxx11_(&local_88,(aux *)((long)&j._M_node + 4),ep);
      ::std::__cxx11::string::c_str();
      (**(code **)((ppVar4->first).first_seen.__d.__r + 8))(ppVar4,4,"[%u] not alive: %s",uVar3);
      ::std::__cxx11::string::~string((string *)&local_88);
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<libtorrent::dht::observer>_*,_std::vector<std::shared_ptr<libtorrent::dht::observer>,_std::allocator<std::shared_ptr<libtorrent::dht::observer>_>_>_>
    ::operator++(&end);
  }
  bVar1 = ::std::function::operator_cast_to_bool((function *)&this->m_nodes_callback);
  if (bVar1) {
    ::std::
    function<void_(const_std::vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_&)>
    ::operator()(&this->m_nodes_callback,
                 (vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_30);
  }
  traversal_algorithm::done(&this->super_traversal_algorithm);
  ::std::
  vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<libtorrent::dht::node_entry,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_30);
  return;
}

Assistant:

void find_data::done()
{
	m_done = true;

#ifndef TORRENT_DISABLE_LOGGING
	auto* logger = get_node().observer();
	if (logger != nullptr)
	{
		logger->log(dht_logger::traversal, "[%u] %s DONE"
			, id(), name());
	}
#endif

	std::vector<std::pair<node_entry, std::string>> results;
	int num_results = m_node.m_table.bucket_size();
	for (auto i = m_results.begin()
		, end(m_results.end()); i != end && num_results > 0; ++i)
	{
		observer_ptr const& o = *i;
		if (!(o->flags & observer::flag_alive))
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal, "[%u] not alive: %s"
					, id(), aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			continue;
		}
		auto j = m_write_tokens.find(o->id());
		if (j == m_write_tokens.end())
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (logger != nullptr && logger->should_log(dht_logger::traversal))
			{
				logger->log(dht_logger::traversal, "[%u] no write token: %s"
					, id(), aux::print_endpoint(o->target_ep()).c_str());
			}
#endif
			continue;
		}
		results.emplace_back(node_entry(o->id(), o->target_ep()), j->second);
#ifndef TORRENT_DISABLE_LOGGING
		if (logger != nullptr && logger->should_log(dht_logger::traversal))
		{
			logger->log(dht_logger::traversal, "[%u] %s"
				, id(), aux::print_endpoint(o->target_ep()).c_str());
		}
#endif
		--num_results;
	}

	if (m_nodes_callback) m_nodes_callback(results);

	traversal_algorithm::done();
}